

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info_router.cpp
# Opt level: O0

void __thiscall InfoRouter::RegisterFunc(InfoRouter *this,string *name,CommonFunc *func)

{
  size_type sVar1;
  __shared_ptr_access<FuncThread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  int local_34;
  undefined1 local_30 [4];
  int i;
  unique_lock<std::mutex> lock;
  CommonFunc *func_local;
  string *name_local;
  InfoRouter *this_local;
  
  lock._8_8_ = func;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->_mutex);
  local_34 = 0;
  while( true ) {
    sVar1 = std::vector<std::shared_ptr<FuncThread>,_std::allocator<std::shared_ptr<FuncThread>_>_>
            ::size(&this->_func_thread_vec);
    if ((int)sVar1 <= local_34) break;
    this_00 = (__shared_ptr_access<FuncThread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<FuncThread>,_std::allocator<std::shared_ptr<FuncThread>_>_>::
              operator[](&this->_func_thread_vec,(long)local_34);
    this_01 = std::__shared_ptr_access<FuncThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    FuncThread::RegisterFunc(this_01,name,(CommonFunc *)lock._8_8_);
    local_34 = local_34 + 1;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return;
}

Assistant:

void InfoRouter::RegisterFunc(const std::string& name, const CommonFunc& func) {
    std::unique_lock<std::mutex> lock(_mutex);
    for (int i = 0; i < (int)_func_thread_vec.size(); i++) {
        _func_thread_vec[i]->RegisterFunc(name, func);
    }
}